

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3Module.cpp
# Opt level: O1

void __thiscall w3Module::read_exports(w3Module *this,uint8_t **cursor)

{
  undefined8 *puVar1;
  w3Export *this_00;
  int iVar2;
  pointer pwVar3;
  w3Export *pwVar4;
  w3Export **ppwVar5;
  byte bVar6;
  uint32_t uVar7;
  PCH pcVar8;
  char *expr;
  long lVar9;
  ulong uVar10;
  ulong __new_size;
  undefined1 local_68 [16];
  _Alloc_hider local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  w3BuiltinString local_38;
  bool local_34;
  
  puts("reading section 7");
  uVar7 = ::read_varuint32(cursor,this->end);
  __new_size = (ulong)uVar7;
  printf("reading exports7 count:%lX\n",__new_size);
  std::vector<w3Export,_std::allocator<w3Export>_>::resize(&this->exports,__new_size);
  if (uVar7 != 0) {
    lVar9 = 0;
    uVar10 = 0;
    do {
      pwVar3 = (this->exports).super__Vector_base<w3Export,_std::allocator<w3Export>_>._M_impl.
               super__Vector_impl_data._M_start;
      read_string((WasmString *)local_68,this,cursor);
      puVar1 = (undefined8 *)((long)&(pwVar3->name).data + lVar9);
      *puVar1 = local_68._0_8_;
      puVar1[1] = local_68._8_8_;
      std::__cxx11::string::operator=((string *)(puVar1 + 2),(string *)&local_58);
      *(bool *)((long)puVar1 + 0x34) = local_34;
      *(w3BuiltinString *)(puVar1 + 6) = local_38;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_p != &local_48) {
        operator_delete(local_58._M_p,local_48._M_allocated_capacity + 1);
      }
      this_00 = (w3Export *)((long)&(pwVar3->name).data + lVar9);
      bVar6 = ::read_byte(cursor,this->end);
      *(uint *)((long)&pwVar3->tag + lVar9) = (uint)bVar6;
      uVar7 = ::read_varuint32(cursor,this->end);
      *(uint32_t *)((long)&pwVar3->field_4 + lVar9) = uVar7;
      iVar2 = *(int *)((long)&(pwVar3->name).builtin + lVar9);
      (&pwVar3->is_main)[lVar9] = iVar2 == 1;
      (&pwVar3->is_start)[lVar9] = iVar2 == 2;
      pcVar8 = WasmString::c_str((WasmString *)this_00);
      printf("read_export %lX:%lX %s tag:%X index:%X is_main:%X is_start:%X\n",uVar10,__new_size,
             pcVar8,(ulong)*(uint *)((long)&pwVar3->tag + lVar9),
             (ulong)*(uint *)((long)&pwVar3->field_4 + lVar9),(ulong)(&pwVar3->is_main)[lVar9],
             (ulong)(&pwVar3->is_start)[lVar9]);
      if ((&pwVar3->is_start)[lVar9] == true) {
        pwVar4 = this->start;
        expr = "!start";
        ppwVar5 = &this->start;
joined_r0x0010f296:
        if (pwVar4 != (w3Export *)0x0) {
          AssertFailed(expr);
        }
        *ppwVar5 = this_00;
      }
      else if ((&pwVar3->is_main)[lVar9] == true) {
        pwVar4 = this->main;
        expr = "!main";
        ppwVar5 = &this->main;
        goto joined_r0x0010f296;
      }
      uVar10 = uVar10 + 1;
      lVar9 = lVar9 + 0x48;
    } while (__new_size != uVar10);
  }
  printf("read exports7 size:%lX\n",__new_size);
  return;
}

Assistant:

void w3Module::read_exports (uint8_t** cursor)
{
    printf ("reading section 7\n");
    const size_t size = read_varuint32 (cursor);
    printf ("reading exports7 count:%" FORMAT_SIZE "X\n", size);
    exports.resize (size);
    for (size_t i = 0; i < size; ++i)
    {
        w3Export& a = exports [i];
        a.name = read_string (cursor);
        a.tag = (w3ExportTag)read_byte (cursor);
        a.function = read_varuint32 (cursor);
        a.is_main = a.name.builtin == w3BuiltinString_main;
        a.is_start = a.name.builtin == w3BuiltinString_start;
        printf ("read_export %" FORMAT_SIZE "X:%" FORMAT_SIZE "X %s tag:%X index:%X is_main:%X is_start:%X\n", i, size, a.name.c_str (), a.tag, a.function, a.is_main, a.is_start);

        if (a.is_start)
        {
            Assert (!start);
            start = &a;
        }
        else if (a.is_main)
        {
            Assert (!main);
            main = &a;
        }
    }
    printf ("read exports7 size:%" FORMAT_SIZE "X\n", size);
}